

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void NOPLL_Clock(opll_t *chip,int32_t *buffer)

{
  int32_t *buffer_local;
  opll_t *chip_local;
  
  *buffer = (int)chip->output_m;
  buffer[1] = (int)chip->output_r;
  if (chip->cycles == 0) {
    chip->lfo_am_out = (byte)((int)(uint)chip->lfo_am_counter >> 3) & 0xf;
  }
  chip->rm_enable = chip->rm_enable >> 1;
  OPLL_DoModeWrite(chip);
  chip->rm_select = chip->rm_select + 1;
  if (5 < chip->rm_select) {
    chip->rm_select = 6;
  }
  if ((chip->cycles == 0xb) && (((int)chip->rm_enable & 0x80U) == 0x80)) {
    chip->rm_select = 0;
  }
  OPLL_PreparePatch1(chip);
  OPLL_Channel(chip);
  OPLL_PhaseGenerate(chip);
  OPLL_Operator(chip);
  OPLL_PhaseCalcIncrement(chip);
  OPLL_EnvelopeOutput(chip);
  OPLL_EnvelopeKSLTL(chip);
  OPLL_EnvelopeGenerate(chip);
  OPLL_DoLFO(chip);
  OPLL_DoRhythm(chip);
  OPLL_PreparePatch2(chip);
  OPLL_DoRegWrite(chip);
  OPLL_DoIO(chip);
  chip->cycles = (chip->cycles + 1) % 0x12;
  return;
}

Assistant:

void NOPLL_Clock(opll_t *chip, int32_t *buffer) {
    buffer[0] = chip->output_m;
    buffer[1] = chip->output_r;
    if (chip->cycles == 0) {
        chip->lfo_am_out = (chip->lfo_am_counter >> 3) & 0x0f;
    }
    chip->rm_enable >>= 1;
    OPLL_DoModeWrite(chip);
    chip->rm_select++;
    if (chip->rm_select > rm_num_tc) {
        chip->rm_select = rm_num_tc + 1;
    }
    if (chip->cycles == 11 && (chip->rm_enable & 0x80) == 0x80) {
        chip->rm_select = rm_num_bd0;
    }
    OPLL_PreparePatch1(chip);

    OPLL_Channel(chip);

    OPLL_PhaseGenerate(chip);

    OPLL_Operator(chip);

    OPLL_PhaseCalcIncrement(chip);

    OPLL_EnvelopeOutput(chip);
    OPLL_EnvelopeKSLTL(chip);
    OPLL_EnvelopeGenerate(chip);

    OPLL_DoLFO(chip);
    OPLL_DoRhythm(chip);
    OPLL_PreparePatch2(chip);
    OPLL_DoRegWrite(chip);
    OPLL_DoIO(chip);
    chip->cycles = (chip->cycles + 1) % 18;

}